

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O0

string * ts2string_abi_cxx11_(double _zt,int secDecimals)

{
  undefined8 uVar1;
  string *in_RDI;
  allocator<char> *__a;
  __type_conflict _Var2;
  char s [100];
  undefined8 in_stack_ffffffffffffff18;
  float __y;
  double in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  string local_98 [32];
  char local_78 [64];
  time_t in_stack_ffffffffffffffc8;
  
  ts2string_abi_cxx11_(in_stack_ffffffffffffffc8);
  uVar1 = std::__cxx11::string::c_str();
  __y = (float)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  __a = (allocator<char> *)std::fmod<double,float>(in_stack_ffffffffffffff20,__y);
  _Var2 = std::pow<double,int>(in_stack_ffffffffffffff20,(int)__y);
  snprintf(local_78,100,"%s.%dZ",uVar1,(ulong)(uint)(int)((double)__a * _Var2));
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,__a);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5b);
  return in_RDI;
}

Assistant:

std::string ts2string (double _zt, int secDecimals)
{
    char s[100];
    snprintf(s, sizeof(s), "%s.%dZ",
             ts2string(time_t(_zt)).c_str(),
             int(std::fmod(_zt, 1.0f) * std::pow(10.0,secDecimals)) );
    return std::string(s);
}